

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_file.cpp
# Opt level: O0

ssize_t libtorrent::aux::anon_unknown_1::copy_range
                  (int fd_in,int fd_out,off_t in_offset,int64_t len,copy_range_mode *m,
                  storage_error *se)

{
  int val;
  long lVar1;
  int *piVar2;
  ssize_t sVar3;
  error_category *cat;
  bool local_61;
  int err;
  ssize_t ret;
  off_t out_offset;
  ssize_t total_copied;
  storage_error *se_local;
  copy_range_mode *m_local;
  int64_t len_local;
  off_t in_offset_local;
  int fd_out_local;
  int fd_in_local;
  
  total_copied = (ssize_t)se;
  se_local = (storage_error *)m;
  m_local = (copy_range_mode *)len;
  len_local = in_offset;
  in_offset_local._0_4_ = fd_out;
  in_offset_local._4_4_ = fd_in;
  if ((m->use_fallback & 1U) == 0) {
    out_offset = 0;
    ret = in_offset;
    do {
      lVar1 = copy_file_range(in_offset_local._4_4_,&len_local,(int)in_offset_local,&ret,m_local,0);
      if (lVar1 < 0) {
        piVar2 = __errno_location();
        sVar3 = total_copied;
        val = *piVar2;
        if ((val != 0x12) && (val != 0x5f)) {
          *(undefined1 *)(total_copied + 0x13) = 0x19;
          cat = boost::system::system_category();
          boost::system::error_code::assign((error_code *)sVar3,val,cat);
          return -1;
        }
        *(undefined1 *)&(se_local->ec).val_ = 1;
        sVar3 = copy_range_fallback(in_offset_local._4_4_,(int)in_offset_local,len_local,
                                    (int64_t)m_local,(storage_error *)total_copied);
        return sVar3;
      }
      m_local = m_local + -lVar1;
      out_offset = lVar1 + out_offset;
      local_61 = 0 < (long)m_local && 0 < lVar1;
      _fd_out_local = out_offset;
    } while (local_61);
  }
  else {
    _fd_out_local = copy_range_fallback(fd_in,fd_out,in_offset,len,se);
  }
  return _fd_out_local;
}

Assistant:

ssize_t copy_range(int const fd_in, int const fd_out, off_t in_offset
	, std::int64_t len, copy_range_mode* const m, storage_error& se)
{
#if TORRENT_HAS_COPY_FILE_RANGE
	if (m->use_fallback)
		return copy_range_fallback(fd_in, fd_out, in_offset, len, se);

	ssize_t total_copied = 0;
	off_t out_offset = in_offset;
	ssize_t ret = 0;
	do
	{
		ret = ::copy_file_range(fd_in, &in_offset
			, fd_out, &out_offset, std::size_t(len), 0);
		if (ret < 0)
		{
			int const err = errno;
			if (err == EXDEV || err == ENOTSUP)
			{
				m->use_fallback = true;
				return copy_range_fallback(fd_in, fd_out, in_offset, len, se);
			}
			se.operation = operation_t::file_copy;
			se.ec.assign(err, system_category());
			return -1;
		}

		len -= ret;
		total_copied += ret;
	} while (len > 0 && ret > 0);
	return total_copied;
#else
	TORRENT_UNUSED(m);
	return copy_range_fallback(fd_in, fd_out, in_offset, len, se);
#endif
}